

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall FSlide::SlideMove(FSlide *this,AActor *mo,DVector2 *tryp,int numsteps)

{
  double dVar1;
  player_t *ppVar2;
  DVector2 *pDVar3;
  bool bVar4;
  secplane_t *psVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  DVector2 move;
  DVector2 lead;
  DVector2 local_c8;
  double local_b8;
  undefined8 uStack_b0;
  DVector2 local_a8;
  double local_98;
  undefined8 uStack_90;
  DVector2 *local_80;
  DVector2 local_78;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  this->slidemo = mo;
  if (((mo->player == (player_t *)0x0) || (mo->player->mo != (APlayerPawn *)mo)) ||
     (mo->reactiontime < 1)) {
    local_80 = &this->tmmove;
    local_68 = (double)numsteps;
    iVar6 = -3;
    dStack_60 = local_68;
    while (iVar6 = iVar6 + 1, iVar6 != 0) {
      dVar7 = mo->radius;
      local_c8.X = tryp->X;
      local_c8.Y = tryp->Y;
      dVar8 = -dVar7;
      if (local_c8.X <= 0.0) {
        dVar8 = dVar7;
      }
      local_58 = (mo->__Pos).X;
      local_98 = (double)(~-(ulong)(0.0 < local_c8.X) & (ulong)-dVar7 |
                         -(ulong)(0.0 < local_c8.X) & (ulong)dVar7) + local_58;
      dVar1 = (mo->__Pos).Y;
      if (local_c8.Y <= 0.0) {
        local_b8 = dVar1 + dVar7;
        local_78.Y = dVar1 - dVar7;
      }
      else {
        local_78.Y = dVar1 + dVar7;
        local_b8 = dVar1 - dVar7;
      }
      uStack_b0 = 0;
      uStack_40 = 0;
      local_58 = local_58 + dVar8;
      uStack_50 = 0;
      this->bestSlidefrac = 1.01;
      local_c8.X = local_c8.X + local_98;
      local_c8.Y = local_c8.Y + local_78.Y;
      uStack_90 = 0x8000000000000000;
      local_78.X = local_98;
      local_48 = local_78.Y;
      SlideTraverse(this,&local_78,&local_c8);
      local_c8.X = local_58;
      local_c8.Y = local_48;
      local_a8.X = local_58 + tryp->X;
      local_a8.Y = local_48 + tryp->Y;
      SlideTraverse(this,&local_c8,&local_a8);
      local_c8.X = local_98;
      local_c8.Y = local_b8;
      local_a8.X = local_98 + tryp->X;
      local_a8.Y = local_b8 + tryp->Y;
      SlideTraverse(this,&local_c8,&local_a8);
      if (1.0 < this->bestSlidefrac) break;
      dVar7 = this->bestSlidefrac + -0.03125;
      this->bestSlidefrac = dVar7;
      if (0.0 < dVar7) {
        local_b8 = (mo->Vel).X;
        local_98 = (mo->Vel).Y;
        local_c8.X = (mo->__Pos).X + dVar7 * tryp->X;
        local_c8.Y = (mo->__Pos).Y + dVar7 * tryp->Y;
        bVar4 = P_TryMove(mo,&local_c8,1,(secplane_t *)0x0);
        if (!bVar4) break;
        dVar7 = (mo->Vel).X;
        if (dVar7 != local_b8) {
          return;
        }
        if (NAN(dVar7) || NAN(local_b8)) {
          return;
        }
        dVar7 = (mo->Vel).Y;
        if (dVar7 != local_98) {
          return;
        }
        if (NAN(dVar7) || NAN(local_98)) {
          return;
        }
        dVar7 = this->bestSlidefrac;
      }
      dVar7 = 1.0 - (dVar7 + 0.03125);
      this->bestSlidefrac = dVar7;
      if (dVar7 <= 1.0) {
        if (dVar7 <= 0.0) {
          return;
        }
      }
      else {
        this->bestSlidefrac = 1.0;
        dVar7 = 1.0;
      }
      dVar8 = dVar7 * tryp->X;
      dVar7 = dVar7 * tryp->Y;
      (this->tmmove).X = dVar8;
      (this->tmmove).Y = dVar7;
      tryp->X = dVar8;
      tryp->Y = dVar7;
      HitSlideLine(this,this->bestslideline);
      pDVar3 = local_80;
      dVar7 = (this->tmmove).X * local_68;
      dVar8 = (this->tmmove).Y * dStack_60;
      (mo->Vel).X = dVar7;
      (mo->Vel).Y = dVar8;
      ppVar2 = mo->player;
      if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)mo)) {
        if (ABS(dVar7) < ABS((ppVar2->Vel).X)) {
          (ppVar2->Vel).X = dVar7;
        }
        if (ABS(dVar8) < ABS((ppVar2->Vel).Y)) {
          (ppVar2->Vel).Y = dVar8;
        }
      }
      psVar5 = P_CheckSlopeWalk(mo,local_80);
      local_c8.X = pDVar3->X + (mo->__Pos).X;
      local_c8.Y = pDVar3->Y + (mo->__Pos).Y;
      bVar4 = P_TryMove(mo,&local_c8,1,psVar5);
      if (bVar4) {
        return;
      }
    }
    local_c8.Y = tryp->Y;
    local_c8.X = 0.0;
    psVar5 = P_CheckSlopeWalk(mo,&local_c8);
    local_a8.X = (mo->__Pos).X + local_c8.X;
    local_a8.Y = (mo->__Pos).Y + local_c8.Y;
    bVar4 = P_TryMove(mo,&local_a8,1,psVar5);
    if (!bVar4) {
      local_c8.X = tryp->X;
      local_c8.Y = 0.0;
      psVar5 = P_CheckSlopeWalk(mo,&local_c8);
      local_a8.X = (mo->__Pos).X + local_c8.X;
      local_a8.Y = (mo->__Pos).Y + local_c8.Y;
      P_TryMove(mo,&local_a8,1,psVar5);
    }
  }
  return;
}

Assistant:

void FSlide::SlideMove(AActor *mo, DVector2 tryp, int numsteps)
{
	DVector2 lead;
	DVector2 trail;
	DVector2 newpos;
	DVector2 move;
	const secplane_t * walkplane;
	int hitcount;

	hitcount = 3;
	slidemo = mo;

	if (mo->player && mo->player->mo == mo && mo->reactiontime > 0)
		return;	// player coming right out of a teleporter.

retry:
	if (!--hitcount)
		goto stairstep; 		// don't loop forever

	// trace along the three leading corners
	if (tryp.X > 0)
	{
		lead.X = mo->X() + mo->radius;
		trail.X = mo->X() - mo->radius;
	}
	else
	{
		lead.X = mo->X() - mo->radius;
		trail.X = mo->X() + mo->radius;
	}

	if (tryp.Y > 0)
	{
		lead.Y = mo->Y() + mo->radius;
		trail.Y = mo->Y() - mo->radius;
	}
	else
	{
		lead.Y = mo->Y() - mo->radius;
		trail.Y = mo->Y() + mo->radius;
	}

	bestSlidefrac = 1.01;

	SlideTraverse(lead, lead + tryp);
	SlideTraverse(DVector2(trail.X, lead.Y), tryp + DVector2(trail.X, lead.Y));
	SlideTraverse(DVector2(lead.X, trail.Y), tryp + DVector2(lead.X, trail.Y));

	// move up to the wall
	if (bestSlidefrac > 1)
	{
		// the move must have hit the middle, so stairstep
	stairstep:
		// killough 3/15/98: Allow objects to drop off ledges
		move = { 0, tryp.Y };
		walkplane = P_CheckSlopeWalk(mo, move);
		if (!P_TryMove(mo, mo->Pos() + move, true, walkplane))
		{
			move = { tryp.X, 0 };
			walkplane = P_CheckSlopeWalk(mo, move);
			P_TryMove(mo, mo->Pos() + move, true, walkplane);
		}
		return;
	}

	// fudge a bit to make sure it doesn't hit
	bestSlidefrac -= 1. / 32;
	if (bestSlidefrac > 0)
	{
		newpos = tryp * bestSlidefrac;

		// [BL] We need to abandon this function if we end up going through a teleporter
		const DVector2 startvel = mo->Vel.XY();

		// killough 3/15/98: Allow objects to drop off ledges
		if (!P_TryMove(mo, mo->Pos() + newpos, true))
			goto stairstep;

		if (mo->Vel.XY() != startvel)
			return;
	}

	// Now continue along the wall.
	bestSlidefrac = 1. - (bestSlidefrac + 1. / 32);	// remainder
	if (bestSlidefrac > 1)
		bestSlidefrac = 1;
	else if (bestSlidefrac <= 0)
		return;

	tryp = tmmove = tryp*bestSlidefrac;

	HitSlideLine(bestslideline); 	// clip the moves

	mo->Vel.X = tmmove.X * numsteps;
	mo->Vel.Y = tmmove.Y * numsteps;

	// killough 10/98: affect the bobbing the same way (but not voodoo dolls)
	if (mo->player && mo->player->mo == mo)
	{
		if (fabs(mo->player->Vel.X) > fabs(mo->Vel.X))
			mo->player->Vel.X = mo->Vel.X;
		if (fabs(mo->player->Vel.Y) > fabs(mo->Vel.Y))
			mo->player->Vel.Y = mo->Vel.Y;
	}

	walkplane = P_CheckSlopeWalk(mo, tmmove);

	// killough 3/15/98: Allow objects to drop off ledges
	if (!P_TryMove(mo, mo->Pos() + tmmove, true, walkplane))
	{
		goto retry;
	}
}